

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall wasm::TranslateToFuzzReader::fixAfterChanges::Fixer::replace(Fixer *this)

{
  Function *pFVar1;
  undefined8 uVar2;
  Expression *pEVar3;
  const_iterator cVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  Expression **ppEVar7;
  unordered_map<wasm::Expression_*,_std::optional<wasm::Function::DebugLocation>,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>_>
  *this_00;
  Expression *local_38;
  Expression *local_30;
  
  pEVar3 = makeTrivial(this->parent,
                       (Type)((*(this->
                                super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                                ).
                                super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                                .super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                                replacep)->type).id);
  ppEVar7 = (this->super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>)
            .super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
            super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep;
  pFVar1 = (this->super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>).
           super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
           super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.currFunction;
  if (pFVar1 != (Function *)0x0) {
    local_38 = *ppEVar7;
    local_30 = pEVar3;
    if ((pFVar1->debugLocations)._M_h._M_element_count != 0) {
      this_00 = &pFVar1->debugLocations;
      cVar4 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,&local_30);
      if (cVar4.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        iVar5 = std::
                _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this_00->_M_h,&local_38);
        if (iVar5.
            super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
            ._M_cur != (__node_type *)0x0) {
          pmVar6 = std::__detail::
                   _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,&local_30);
          uVar2 = *(undefined8 *)
                   ((long)iVar5.
                          super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                          ._M_cur + 0x18);
          *(undefined8 *)
           &(pmVar6->super__Optional_base<wasm::Function::DebugLocation,_true,_true>)._M_payload.
            super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload =
               *(undefined8 *)
                ((long)iVar5.
                       super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                       ._M_cur + 0x10);
          *(undefined8 *)
           ((long)&(pmVar6->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                   _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload
           + 8) = uVar2;
          *(undefined8 *)
           ((long)&(pmVar6->super__Optional_base<wasm::Function::DebugLocation,_true,_true>).
                   _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload
                   ._M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>.
                   _M_payload + 4) =
               *(undefined8 *)
                ((long)iVar5.
                       super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::optional<wasm::Function::DebugLocation>_>,_false>
                       ._M_cur + 0x20);
        }
      }
    }
    ppEVar7 = (this->
              super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>).
              super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
              super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep;
  }
  *ppEVar7 = pEVar3;
  ppEVar7 = SmallVector<wasm::Expression_*,_10UL>::back
                      (&(this->
                        super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                        ).expressionStack);
  *ppEVar7 = pEVar3;
  return;
}

Assistant:

void replace() { replaceCurrent(parent.makeTrivial(getCurrent()->type)); }